

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,Belief *belief,History *history,int hstart)

{
  DSPOMDP *pDVar1;
  double dVar2;
  pointer ppSVar3;
  log_ostream *plVar4;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int i;
  int i_1;
  uint uVar9;
  ulong uVar10;
  int i_3;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar12;
  double dVar13;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  State *particle;
  OBS_TYPE obs;
  double reward;
  int local_a0;
  double local_98;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_88;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  ulong local_50;
  double local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = -INFINITY;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = 1.0 / (double)num;
  local_50 = (ulong)hstart;
  iVar8 = 0;
  local_a0 = 0;
  iVar6 = 0;
  do {
    uVar10 = (ulong)iVar8;
    if ((num <= iVar6) && (num * 200 <= local_a0)) {
      for (; uVar10 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar10 = uVar10 + 1) {
        (*belief->model_->_vptr_DSPOMDP[0x17])
                  (belief->model_,local_88._M_impl.super__Vector_impl_data._M_start[uVar10]);
      }
      ppSVar3 = (__return_storage_ptr__->
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      dVar13 = 0.0;
      for (uVar10 = 0;
          uVar7 = (long)(__return_storage_ptr__->
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3,
          uVar10 < uVar7; uVar10 = uVar10 + 1) {
        dVar2 = exp(ppSVar3[uVar10]->weight - local_98);
        ppSVar3 = (__return_storage_ptr__->
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppSVar3[uVar10]->weight = dVar2;
        dVar13 = dVar13 + dVar2;
      }
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        ppSVar3[uVar10]->weight = ppSVar3[uVar10]->weight / dVar13;
      }
      iVar6 = logging::level();
      if ((0 < iVar6) && (iVar6 = logging::level(), 3 < iVar6)) {
        plVar4 = logging::stream(4);
        poVar5 = std::operator<<(&plVar4->super_ostream,"[Belief::Resample] Resampled ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," particles");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      for (uVar10 = 0;
          uVar10 < (ulong)((long)(__return_storage_ptr__->
                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(__return_storage_ptr__->
                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar10 = uVar10 + 1) {
        iVar6 = logging::level();
        if ((0 < iVar6) && (iVar6 = logging::level(), 4 < iVar6)) {
          plVar4 = logging::stream(5);
          poVar5 = std::operator<<(&plVar4->super_ostream," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar10);
          poVar5 = std::operator<<(poVar5," = ");
          poVar5 = despot::operator<<(poVar5,(__return_storage_ptr__->
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar10]);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_88)
      ;
      return __return_storage_ptr__;
    }
    if ((long)local_88._M_impl.super__Vector_impl_data._M_finish -
        (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3 == uVar10) {
      (*belief->_vptr_Belief[2])(&local_68,belief,(ulong)(uint)num);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_88,&local_68);
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_68)
      ;
      iVar8 = 0;
    }
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_88._M_impl.super__Vector_impl_data._M_start[iVar8];
    local_a0 = local_a0 + 1;
    dVar13 = 0.0;
    for (uVar10 = local_50; ppSVar3 = local_68._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2); uVar10 = uVar10 + 1)
    {
      pDVar1 = belief->model_;
      dVar2 = Random::NextDouble((Random *)&Random::RANDOM);
      (*pDVar1->_vptr_DSPOMDP[2])
                (SUB84(dVar2,0),pDVar1,ppSVar3,
                 (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar10],local_38,local_40);
      (*belief->model_->_vptr_DSPOMDP[7])
                (belief->model_,
                 (history->observations_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10],
                 local_68._M_impl.super__Vector_impl_data._M_start,
                 (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar10]);
      if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0 ||
          (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 0.0) {
        (*belief->model_->_vptr_DSPOMDP[0x17])
                  (belief->model_,local_68._M_impl.super__Vector_impl_data._M_start);
        break;
      }
      dVar2 = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      dVar13 = dVar13 + dVar2;
    }
    if (((MemoryObject *)((long)local_68._M_impl.super__Vector_impl_data._M_start + 8))->allocated_
        == true) {
      *(double *)((long)local_68._M_impl.super__Vector_impl_data._M_start + 0x18) = dVar13;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (__return_storage_ptr__,(value_type *)&local_68);
      uVar11 = SUB84(local_98,0);
      uVar12 = (undefined4)((ulong)local_98 >> 0x20);
      if (local_98 <= dVar13) {
        uVar11 = SUB84(dVar13,0);
        uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
      }
      local_98 = (double)CONCAT44(uVar12,uVar11);
      iVar6 = iVar6 + 1;
    }
    if (iVar6 == num) {
      uVar10 = (ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
      iVar6 = num;
      while( true ) {
        uVar10 = uVar10 - 1;
        if ((int)(uint)uVar10 < 0) break;
        uVar9 = (uint)uVar10 & 0x7fffffff;
        dVar13 = (__return_storage_ptr__->
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar9]->weight;
        dVar2 = log(local_48);
        if (dVar13 - local_98 < dVar2) {
          (*belief->model_->_vptr_DSPOMDP[0x17])
                    (belief->model_,
                     (__return_storage_ptr__->
                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar9]);
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::erase
                    (__return_storage_ptr__,
                     (const_iterator)
                     ((__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_start + uVar9));
          iVar6 = iVar6 + -1;
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const Belief& belief, History history,
	int hstart) {
	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	int pos = 0;
	double max_wgt = Globals::NEG_INFTY;
	vector<State*> particles;
	int trial = 0;
	while (count < num || trial < 200 * num) {
		// Pick next particle
		if (pos == particles.size()) {
			particles = belief.Sample(num);
			pos = 0;
		}
		State* particle = particles[pos];

		trial++;

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			belief.model_->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = belief.model_->ObsProb(history.Observation(i),
				*particle, history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				belief.model_->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
			count++;
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--) {
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					belief.model_->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
			}
		}

		pos++;
	}

	// Free unused particles
	for (int i = pos; i < particles.size(); i++)
		belief.model_->Free(particles[i]);

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}